

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O2

array<unsigned_char,_6UL> __thiscall ixy::IxgbeDevice::get_mac_addr(IxgbeDevice *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  uVar1 = get_reg32(this,0x5400);
  uVar2 = get_reg32(this,0x5404);
  return (_Type)((uint6)(uVar2 & 0xff) << 0x20 | (uint6)(uVar2 >> 8) << 0x28 |
                 (uint6)(uVar1 & 0xff000000) | (uint6)(uVar1 & 0xff0000) | (uint6)(uVar1 & 0xff00) |
                (uint6)(uVar1 & 0xff));
}

Assistant:

auto IxgbeDevice::get_mac_addr() -> std::array<uint8_t, 6> {
    auto low = get_reg32(IXGBE_RAL(0));
    auto high = get_reg32(IXGBE_RAH(0));

    return {
            static_cast<uint8_t>(low),
            static_cast<uint8_t>(low >> 8u),
            static_cast<uint8_t>(low >> 16u),
            static_cast<uint8_t>(low >> 24u),
            static_cast<uint8_t>(high),
            static_cast<uint8_t>(high >> 8u),
    };
}